

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_BREAKC(Context *ctx)

{
  char *pcVar1;
  size_t in_RCX;
  char src1 [64];
  char src0 [64];
  
  pcVar1 = get_METAL_comparison_string_scalar(ctx);
  make_METAL_srcarg_string_scalar(ctx,0,src0,in_RCX);
  make_METAL_srcarg_string_scalar(ctx,1,src1,in_RCX);
  output_line(ctx,"if (%s %s %s) { break; }",src0,pcVar1,src1);
  return;
}

Assistant:

static void emit_METAL_BREAKC(Context *ctx)
{
    const char *comp = get_METAL_comparison_string_scalar(ctx);
    char src0[64]; make_METAL_srcarg_string_scalar(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_scalar(ctx, 1, src1, sizeof (src1));
    output_line(ctx, "if (%s %s %s) { break; }", src0, comp, src1);
}